

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O0

bool __thiscall RTIMUMPU9250::setCompassRate(RTIMUMPU9250 *this)

{
  bool bVar1;
  int local_1c;
  int rate;
  RTIMUMPU9250 *this_local;
  
  local_1c = (this->super_RTIMU).m_sampleRate / this->m_compassRate + -1;
  if (0x1f < local_1c) {
    local_1c = 0x1f;
  }
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,'4'
                             ,(uchar)local_1c,"Failed to set slave ctrl 4");
  return bVar1;
}

Assistant:

bool RTIMUMPU9250::setCompassRate()
{
    int rate;

    rate = m_sampleRate / m_compassRate - 1;

    if (rate > 31)
        rate = 31;
    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_I2C_SLV4_CTRL, rate, "Failed to set slave ctrl 4"))
         return false;
    return true;
}